

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall
HighsSparseMatrix::addRows(HighsSparseMatrix *this,HighsSparseMatrix *new_rows,int8_t *in_partition)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  int *piVar1;
  int iVar2;
  uint uVar3;
  MatrixFormat MVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  MatrixFormat MVar12;
  size_type __new_size;
  size_type sVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  size_type sVar18;
  ulong uVar19;
  pointer piVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  vector<int,_std::allocator<int>_> save_p_end;
  undefined1 local_68 [16];
  pointer local_58;
  vector<double,_std::allocator<double>_> *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  value_type_conflict2 local_34;
  
  iVar2 = new_rows->num_row_;
  __new_size = (size_type)iVar2;
  iVar21 = iVar2;
  if (new_rows->format_ == kColwise) {
    iVar21 = new_rows->num_col_;
  }
  if (__new_size == 0) {
    return;
  }
  uVar3 = (new_rows->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar21];
  MVar4 = this->format_;
  iVar21 = this->num_col_;
  sVar18 = (size_type)iVar21;
  iVar16 = this->num_row_;
  lVar15 = (long)iVar16;
  iVar14 = iVar16;
  if (MVar4 == kColwise) {
    iVar14 = iVar21;
  }
  iVar14 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[iVar14];
  MVar12 = MVar4;
  if ((MVar4 == kColwise) && (iVar14 < (int)uVar3)) {
    ensureRowwise(this);
    MVar12 = this->format_;
  }
  this_00 = &this->start_;
  iVar24 = iVar14 + uVar3;
  if ((MVar12 & ~kColwise) != kRowwise) {
    if (uVar3 == 0) goto LAB_0037b0bd;
    local_68 = (undefined1  [16])0x0;
    local_58 = (pointer)0x0;
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              ((vector<int,_std::allocator<int>_> *)local_68,sVar18,&local_34);
    if (0 < (int)uVar3) {
      piVar20 = (new_rows->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar19 = 0;
      do {
        *(int *)(local_68._0_8_ + (long)piVar20[uVar19] * 4) =
             *(int *)(local_68._0_8_ + (long)piVar20[uVar19] * 4) + 1;
        uVar19 = uVar19 + 1;
      } while (uVar3 != uVar19);
    }
    local_40 = &this->index_;
    std::vector<int,_std::allocator<int>_>::resize(local_40,(long)iVar24);
    local_48 = &this->value_;
    std::vector<double,_std::allocator<double>_>::resize(local_48,(long)iVar24);
    if (0 < iVar21) {
      piVar20 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      piVar5 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (local_48->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar19 = (ulong)(uint)piVar20[sVar18];
      do {
        iVar21 = iVar24 - *(int *)(local_68._0_8_ + (sVar18 - 1) * 4);
        uVar22 = (ulong)(uint)piVar20[sVar18 - 1];
        if (piVar20[sVar18 - 1] < (int)uVar19) {
          lVar15 = (long)(int)uVar19;
          lVar23 = 0;
          do {
            piVar5[(long)iVar21 + lVar23 + -1] = piVar5[lVar15 + lVar23 + -1];
            pdVar8[(long)iVar21 + lVar23 + -1] = pdVar8[lVar15 + lVar23 + -1];
            uVar22 = (ulong)piVar20[sVar18 - 1];
            lVar25 = lVar15 + lVar23;
            lVar23 = lVar23 + -1;
          } while ((long)uVar22 < lVar25 + -1);
          iVar21 = iVar21 + (int)lVar23;
        }
        piVar20[sVar18] = iVar24;
        uVar19 = uVar22 & 0xffffffff;
        bVar10 = 1 < (long)sVar18;
        sVar18 = sVar18 - 1;
        iVar24 = iVar21;
      } while (bVar10);
    }
    if (0 < iVar2) {
      piVar20 = (new_rows->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar5 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (local_48->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar19 = 0;
      do {
        uVar17 = uVar3;
        if (uVar19 < iVar2 - 1) {
          uVar17 = piVar20[uVar19 + 1];
        }
        iVar21 = piVar20[uVar19];
        lVar15 = (long)iVar21;
        if (iVar21 < (int)uVar17) {
          piVar7 = (new_rows->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar9 = (new_rows->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            lVar25 = (long)piVar7[lVar15];
            lVar23 = (long)piVar5[lVar25 + 1] - (long)*(int *)(local_68._0_8_ + lVar25 * 4);
            *(int *)(local_68._0_8_ + lVar25 * 4) = *(int *)(local_68._0_8_ + lVar25 * 4) + -1;
            piVar6[lVar23] = (int)uVar19 + iVar16;
            pdVar8[lVar23] = pdVar9[lVar15];
            lVar15 = lVar15 + 1;
          } while ((int)uVar17 != lVar15);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != __new_size);
    }
    goto LAB_0037b0b3;
  }
  iVar16 = iVar16 + iVar2;
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)(iVar16 + 1));
  auVar11 = _DAT_003beea0;
  if (uVar3 == 0) {
    if (iVar2 < 1) {
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[iVar16] = iVar24;
      goto LAB_0037b0bd;
    }
    piVar20 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar23 = __new_size - 1;
    auVar26._8_4_ = (int)lVar23;
    auVar26._0_8_ = lVar23;
    auVar26._12_4_ = (int)((ulong)lVar23 >> 0x20);
    lVar23 = 0;
    auVar26 = auVar26 ^ _DAT_003beea0;
    auVar27 = _DAT_003bf640;
    auVar28 = _DAT_003bee90;
    do {
      auVar29 = auVar28 ^ auVar11;
      iVar21 = auVar26._4_4_;
      if ((bool)(~(auVar29._4_4_ == iVar21 && auVar26._0_4_ < auVar29._0_4_ ||
                  iVar21 < auVar29._4_4_) & 1)) {
        *(int *)((long)piVar20 + lVar23 + lVar15 * 4) = iVar14;
      }
      if ((auVar29._12_4_ != auVar26._12_4_ || auVar29._8_4_ <= auVar26._8_4_) &&
          auVar29._12_4_ <= auVar26._12_4_) {
        *(int *)((long)piVar20 + lVar23 + lVar15 * 4 + 4) = iVar14;
      }
      auVar29 = auVar27 ^ auVar11;
      iVar30 = auVar29._4_4_;
      if (iVar30 <= iVar21 && (iVar30 != iVar21 || auVar29._0_4_ <= auVar26._0_4_)) {
        *(int *)((long)piVar20 + lVar23 + lVar15 * 4 + 8) = iVar14;
        *(int *)((long)piVar20 + lVar23 + lVar15 * 4 + 0xc) = iVar14;
      }
      lVar25 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 4;
      auVar28._8_8_ = lVar25 + 4;
      lVar25 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 4;
      auVar27._8_8_ = lVar25 + 4;
      lVar23 = lVar23 + 0x10;
    } while ((ulong)(iVar2 + 3U >> 2) << 4 != lVar23);
  }
  else if (0 < iVar2) {
    piVar20 = (new_rows->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar5 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar18 = 0;
    do {
      piVar5[lVar15 + sVar18] = piVar20[sVar18] + iVar14;
      sVar18 = sVar18 + 1;
    } while (__new_size != sVar18);
  }
  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [iVar16] = iVar24;
  if ((int)uVar3 < 1) goto LAB_0037b0bd;
  this_01 = &this->index_;
  std::vector<int,_std::allocator<int>_>::resize(this_01,(long)iVar24);
  this_02 = &this->value_;
  std::vector<double,_std::allocator<double>_>::resize(this_02,(long)iVar24);
  if (MVar4 != kRowwisePartitioned) {
    piVar20 = (new_rows->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar8 = (new_rows->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar19 = 0;
    do {
      piVar5[(long)iVar14 + uVar19] = piVar20[uVar19];
      pdVar9[(long)iVar14 + uVar19] = pdVar8[uVar19];
      uVar19 = uVar19 + 1;
    } while (uVar3 != uVar19);
    goto LAB_0037b0bd;
  }
  if (0 < iVar2) {
    piVar20 = (new_rows->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar21 = *piVar20;
    sVar18 = 0;
    do {
      sVar13 = sVar18 + 1;
      iVar16 = piVar20[sVar18 + 1];
      if (iVar21 < iVar16) {
        piVar5 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (new_rows->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar8 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar23 = (long)iVar21;
        do {
          iVar21 = piVar6[lVar23];
          if (in_partition[iVar21] != '\0') {
            iVar16 = piVar5[sVar18 + lVar15];
            piVar7[iVar16] = iVar21;
            pdVar8[iVar16] =
                 (new_rows->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar23];
            piVar1 = piVar5 + sVar18 + lVar15;
            *piVar1 = *piVar1 + 1;
            iVar16 = piVar20[sVar13];
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 < iVar16);
      }
      iVar21 = iVar16;
      sVar18 = sVar13;
    } while (sVar13 != __new_size);
  }
  local_68 = (undefined1  [16])0x0;
  local_58 = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)local_68,__new_size);
  if (iVar2 < 1) {
LAB_0037b0b3:
    piVar20 = (pointer)local_68._0_8_;
    if ((pointer)local_68._0_8_ == (pointer)0x0) goto LAB_0037b0bd;
  }
  else {
    piVar20 = (new_rows->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar5 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar18 = 0;
    do {
      iVar21 = piVar20[sVar18] + iVar14;
      piVar5[lVar15 + sVar18] = iVar21;
      piVar6[lVar15 + sVar18] = iVar21;
      *(int *)(local_68._0_8_ + sVar18 * 4) = iVar21;
      sVar18 = sVar18 + 1;
    } while (__new_size != sVar18);
    if (iVar2 < 1) goto LAB_0037b0b3;
    piVar20 = (new_rows->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar21 = *piVar20;
    sVar18 = 0;
    do {
      sVar13 = sVar18 + 1;
      iVar16 = piVar20[sVar18 + 1];
      if (iVar21 < iVar16) {
        piVar5 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (new_rows->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar8 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar23 = (long)iVar21;
        do {
          iVar21 = piVar6[lVar23];
          if (in_partition[iVar21] == '\0') {
            iVar16 = piVar5[sVar18 + lVar15];
            piVar7[iVar16] = iVar21;
            pdVar8[iVar16] =
                 (new_rows->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar23];
            piVar1 = piVar5 + sVar18 + lVar15;
            *piVar1 = *piVar1 + 1;
            iVar16 = piVar20[sVar13];
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 < iVar16);
      }
      iVar21 = iVar16;
      sVar18 = sVar13;
    } while (sVar13 != __new_size);
    if (iVar2 < 1) goto LAB_0037b0b3;
    piVar5 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar18 = 0;
    do {
      piVar5[lVar15 + sVar18] = *(int *)(local_68._0_8_ + sVar18 * 4);
      sVar18 = sVar18 + 1;
      piVar20 = (pointer)local_68._0_8_;
    } while (__new_size != sVar18);
  }
  operator_delete(piVar20);
LAB_0037b0bd:
  this->num_row_ = this->num_row_ + iVar2;
  return;
}

Assistant:

void HighsSparseMatrix::addRows(const HighsSparseMatrix new_rows,
                                const int8_t* in_partition) {
  assert(new_rows.isRowwise());
  const HighsInt num_new_row = new_rows.num_row_;
  const HighsInt num_new_nz = new_rows.numNz();
  const vector<HighsInt>& new_matrix_start = new_rows.start_;
  const vector<HighsInt>& new_matrix_index = new_rows.index_;
  const vector<double>& new_matrix_value = new_rows.value_;

  assert(this->formatOk());
  // Adding rows to a row-wise partitioned matrix needs the
  // partition information
  const bool partitioned = this->format_ == MatrixFormat::kRowwisePartitioned;
  if (partitioned) {
    assert(1 == 0);
    assert(in_partition != NULL);
  }
  assert(num_new_row >= 0);
  assert(num_new_nz >= 0);
  if (num_new_row == 0) {
    // No rows are being added, so check that no nonzeros are being
    // added
    assert(num_new_nz == 0);
    return;
  }
  // Adding a positive number of rows to a matrix
  if (num_new_nz) {
    // Nonzeros are being added, so ensure that non-null data are
    // being passed
    assert(!new_matrix_start.empty());
    assert(!new_matrix_index.empty());
    assert(!new_matrix_value.empty());
  }
  HighsInt num_col = this->num_col_;
  HighsInt num_row = this->num_row_;
  HighsInt num_nz = this->numNz();
  // Check that nonzeros aren't being appended to a matrix with no columns
  assert(num_new_nz <= 0 || num_col > 0);

  if (this->isColwise()) {
    // Matrix is currently a standard col-wise matrix, so flip
    // row-wise if there are more new nonzeros than current nonzeros
    if (num_new_nz > num_nz) this->ensureRowwise();
  }
  // Determine the new number of rows and nonzeros in the matrix
  HighsInt new_num_nz = num_nz + num_new_nz;
  HighsInt new_num_row = num_row + num_new_row;

  if (this->isRowwise()) {
    // Matrix is row-wise
    this->start_.resize(new_num_row + 1);
    // Append the starts of the new rows
    if (num_new_nz) {
      // Nontrivial number of nonzeros being added, so use new_matrix_start
      for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++)
        this->start_[num_row + iNewRow] = num_nz + new_matrix_start[iNewRow];
    } else {
      // No nonzeros being added, so new_matrix_start may be NULL, but entries
      // of zero are implied.
      for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++)
        this->start_[num_row + iNewRow] = num_nz;
    }
    this->start_[new_num_row] = new_num_nz;
    if (num_new_nz > 0) {
      // Adding a non-trivial matrix: resize the matrix arrays accordingly
      this->index_.resize(new_num_nz);
      this->value_.resize(new_num_nz);
      // Copy in the new indices and values
      if (partitioned) {
        // Insert the entries in the partition
        assert(1 == 0);
        for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++) {
          HighsInt iRow = num_row + iNewRow;
          for (HighsInt iNewEl = new_matrix_start[iNewRow];
               iNewEl < new_matrix_start[iNewRow + 1]; iNewEl++) {
            HighsInt iCol = new_matrix_index[iNewEl];
            if (in_partition[iCol]) {
              HighsInt iEl = this->start_[iRow];
              this->index_[iEl] = new_matrix_index[iNewEl];
              this->value_[iEl] = new_matrix_value[iNewEl];
              this->start_[iRow]++;
            }
          }
        }
        // Use the incremented starts to initialise p_end, save these
        // values and reset the starts
        vector<HighsInt> save_p_end;
        save_p_end.resize(num_new_row);
        for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++) {
          HighsInt iRow = num_row + iNewRow;
          this->start_[iRow] = num_nz + new_matrix_start[iNewRow];
          this->p_end_[iRow] = this->start_[iRow];
          save_p_end[iNewRow] = this->p_end_[iRow];
        }
        // Insert the entries not in the partition
        for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++) {
          HighsInt iRow = num_row + iNewRow;
          for (HighsInt iNewEl = new_matrix_start[iNewRow];
               iNewEl < new_matrix_start[iNewRow + 1]; iNewEl++) {
            HighsInt iCol = new_matrix_index[iNewEl];
            if (!in_partition[iCol]) {
              HighsInt iEl = this->p_end_[iRow];
              this->index_[iEl] = new_matrix_index[iNewEl];
              this->value_[iEl] = new_matrix_value[iNewEl];
              this->p_end_[iRow]++;
            }
          }
        }
        // Reset p_end using the saved values
        for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++)
          this->p_end_[num_row + iNewRow] = save_p_end[iNewRow];
      } else {
        for (HighsInt iNewEl = 0; iNewEl < num_new_nz; iNewEl++) {
          this->index_[num_nz + iNewEl] = new_matrix_index[iNewEl];
          this->value_[num_nz + iNewEl] = new_matrix_value[iNewEl];
        }
      }
    }
  } else {
    // Storing the matrix column-wise, so have to insert the new rows
    assert(this->isColwise());
    if (num_new_nz) {
      vector<HighsInt> length;
      length.assign(num_col, 0);
      for (HighsInt iEl = 0; iEl < num_new_nz; iEl++)
        length[new_matrix_index[iEl]]++;
      // Determine the new number of nonzeros and resize the column-wise matrix
      // arrays
      this->index_.resize(new_num_nz);
      this->value_.resize(new_num_nz);
      // Append the new rows
      // Shift the existing columns to make space for the new entries
      HighsInt new_iEl = new_num_nz;
      for (HighsInt iCol = num_col - 1; iCol >= 0; iCol--) {
        HighsInt start_col_plus_1 = new_iEl;
        new_iEl -= length[iCol];
        for (HighsInt iEl = this->start_[iCol + 1] - 1;
             iEl >= this->start_[iCol]; iEl--) {
          new_iEl--;
          this->index_[new_iEl] = this->index_[iEl];
          this->value_[new_iEl] = this->value_[iEl];
        }
        this->start_[iCol + 1] = start_col_plus_1;
      }
      assert(new_iEl == 0);
      // Insert the new entries
      for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++) {
        HighsInt first_el = new_matrix_start[iNewRow];
        HighsInt last_el =
            (iNewRow < num_new_row - 1 ? new_matrix_start[iNewRow + 1]
                                       : num_new_nz);
        for (HighsInt iEl = first_el; iEl < last_el; iEl++) {
          HighsInt iCol = new_matrix_index[iEl];
          new_iEl = this->start_[iCol + 1] - length[iCol];
          length[iCol]--;
          this->index_[new_iEl] = num_row + iNewRow;
          this->value_[new_iEl] = new_matrix_value[iEl];
        }
      }
    }
  }
  // Update the number of rows
  this->num_row_ += num_new_row;
}